

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O2

int run_test_semaphore_2(void)

{
  uv_sem_t *puVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uStack_70;
  uv_thread_t thread;
  worker_config_conflict1 wc;
  
  puVar1 = &wc.sem;
  wc.sem._24_8_ = 0;
  wc.sem._8_8_ = 0;
  wc.sem._16_8_ = 0;
  wc.mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  wc.sem.__align = 0;
  wc.mutex._16_8_ = 0;
  wc.mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  wc.mutex.__align = 0;
  wc.mutex._8_8_ = 0;
  wc.delay = 100;
  wc.posted = 0;
  iVar2 = uv_sem_init(puVar1,0);
  if (iVar2 == 0) {
    iVar2 = uv_mutex_init(&wc);
    if (iVar2 == 0) {
      iVar2 = uv_thread_create(&thread,worker,&wc);
      if (iVar2 == 0) {
        uv_sem_wait(puVar1);
        iVar2 = uv_thread_join(&thread);
        if (iVar2 == 0) {
          uv_mutex_destroy(&wc);
          uv_sem_destroy(puVar1);
          return 0;
        }
        pcVar3 = "0 == uv_thread_join(&thread)";
        uStack_70 = 0x57;
      }
      else {
        pcVar3 = "0 == uv_thread_create(&thread, worker, &wc)";
        uStack_70 = 0x53;
      }
    }
    else {
      pcVar3 = "0 == uv_mutex_init(&wc.mutex)";
      uStack_70 = 0x52;
    }
  }
  else {
    pcVar3 = "0 == uv_sem_init(&wc.sem, 0)";
    uStack_70 = 0x51;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-semaphore.c"
          ,uStack_70,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(semaphore_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT(0 == uv_sem_init(&wc.sem, 0));
  ASSERT(0 == uv_mutex_init(&wc.mutex));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  uv_sem_wait(&wc.sem);

  ASSERT(0 == uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}